

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

void __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::mchain_template<>(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
                    *this,environment_t *env,mbox_id_t id,mchain_params_t *params)

{
  size_t sVar1;
  rep rVar2;
  undefined7 uVar3;
  memory_usage_t mVar4;
  overflow_reaction_t oVar5;
  
  abstract_message_chain_t::abstract_message_chain_t(&this->super_abstract_message_chain_t);
  (this->super_abstract_message_chain_t).super_abstract_message_box_t._vptr_abstract_message_box_t =
       (_func_int **)&PTR__mchain_template_0028b750;
  this->m_env = env;
  this->m_status = open;
  this->m_id = id;
  uVar3 = *(undefined7 *)&(params->m_capacity).field_0x1;
  sVar1 = (params->m_capacity).m_max_size;
  mVar4 = (params->m_capacity).m_memory;
  oVar5 = (params->m_capacity).m_overflow_reaction;
  rVar2 = (params->m_capacity).m_overflow_timeout.__r;
  (this->m_capacity).m_unlimited = (params->m_capacity).m_unlimited;
  *(undefined7 *)&(this->m_capacity).field_0x1 = uVar3;
  (this->m_capacity).m_max_size = sVar1;
  (this->m_capacity).m_memory = mVar4;
  (this->m_capacity).m_overflow_reaction = oVar5;
  (this->m_capacity).m_overflow_timeout.__r = rVar2;
  std::function<void_()>::function(&this->m_not_empty_notificator,&params->m_not_empty_notificator);
  details::limited_preallocated_demand_queue::limited_preallocated_demand_queue
            (&this->m_queue,&params->m_capacity);
  (this->m_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->m_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_underflow_cond);
  std::condition_variable::condition_variable(&this->m_overflow_cond);
  this->m_threads_to_wakeup = 0;
  this->m_select_tail = (select_case_t *)0x0;
  return;
}

Assistant:

mchain_template(
			//! SObjectizer Environment for which message chain is created.
			so_5::environment_t & env,
			//! Mbox ID for this chain.
			mbox_id_t id,
			//! Chain parameters.
			const mchain_params_t & params,
			//! Arguments for TRACING_BASE's constructor.
			TRACING_ARGS &&... tracing_args )
			:	TRACING_BASE( std::forward<TRACING_ARGS>(tracing_args)... )
			,	m_env( env )
			,	m_id( id )
			,	m_capacity( params.capacity() )
			,	m_not_empty_notificator( params.not_empty_notificator() )
			,	m_queue( params.capacity() )
			{}